

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

string * __thiscall
pmx::ReadString_abi_cxx11_
          (string *__return_storage_ptr__,pmx *this,istream *stream,uint8_t encoding)

{
  char *pcVar1;
  allocator local_6b;
  allocator local_6a;
  undefined1 local_69;
  char *local_68;
  char *targetStart;
  unsigned_short *puStack_58;
  uint targetSize;
  uint16_t *sourceStart;
  allocator local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> buffer;
  int size;
  uint8_t encoding_local;
  istream *stream_local;
  string *result;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = SUB81(stream,0);
  std::istream::read((char *)this,
                     (long)&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_38);
  if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::vector<char,_std::allocator<char>_>::reserve
              ((vector<char,_std::allocator<char>_> *)local_38,
               (long)(int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    pcVar1 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
    std::istream::read((char *)this,(long)pcVar1);
    if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ == '\0') {
      puStack_58 = (unsigned_short *)
                   std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_38);
      targetStart._4_4_ = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ * 3;
      local_68 = (char *)operator_new__((ulong)targetStart._4_4_);
      memset(local_68,0,(ulong)targetStart._4_4_);
      utf8::utf16to8<unsigned_short_const*,char*>
                (puStack_58,
                 puStack_58 +
                 (int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ / 2,
                 local_68);
      pcVar1 = local_68;
      local_69 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_6a);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a);
      if (local_68 != (char *)0x0) {
        operator_delete__(local_68);
      }
      local_69 = 1;
    }
    else {
      pcVar1 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar1,
                 (long)(int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
                 &local_6b);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b);
    }
  }
  sourceStart._0_4_ = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ReadString(std::istream *stream, uint8_t encoding)
	{
		int size;
		stream->read((char*) &size, sizeof(int));
		std::vector<char> buffer;
		if (size == 0)
		{
			return std::string("");
		}
		buffer.reserve(size);
		stream->read((char*) buffer.data(), size);
		if (encoding == 0)
		{
			// UTF16 to UTF8
			const uint16_t* sourceStart = (uint16_t*)buffer.data();
			const unsigned int targetSize = size * 3; // enough to encode
			char *targetStart = new char[targetSize];
            std::memset(targetStart, 0, targetSize * sizeof(char));
            
            utf8::utf16to8( sourceStart, sourceStart + size/2, targetStart );

			std::string result(targetStart);
            delete [] targetStart;
			return result;
		}
		else
		{
			// the name is already UTF8
			return std::string((const char*)buffer.data(), size);
		}
	}